

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O1

void __thiscall CT::PerformLabeling(CT *this)

{
  uint *puVar1;
  char cVar2;
  int *piVar3;
  Mat1i *pMVar4;
  ulong uVar5;
  uint uVar6;
  Mat1b *pMVar7;
  bool b_external;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  Mat aMStack_a8 [96];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  piVar3 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(aMStack_a8,*piVar3,piVar3[1],4);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  cv::Mat::operator=(aMStack_a8,(Scalar_ *)&local_48);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     aMStack_a8);
  cv::Mat::~Mat(aMStack_a8);
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = 0;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  if (0 < *(int *)&pMVar7->field_0x8) {
    lVar10 = 0;
    do {
      uVar6 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
      uVar5 = (ulong)uVar6;
      if (0 < (int)uVar6) {
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar8 = **(long **)&pMVar4->field_0x48 * lVar10 + *(long *)&pMVar4->field_0x10;
        lVar9 = **(long **)&pMVar7->field_0x48 * lVar10 + *(long *)&pMVar7->field_0x10;
        lVar11 = 0;
        do {
          cVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
          if (*(char *)(lVar9 + lVar11) == cVar2) {
            uVar6 = *(uint *)(lVar8 + lVar11 * 4);
            if ((uVar6 == 0) && ((lVar11 == 0 || (*(char *)(lVar9 + -1 + lVar11) != cVar2)))) {
              uVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
              (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
              b_external = true;
            }
            else {
              if ((((int)uVar5 + -1 <= lVar11) || (*(char *)(lVar9 + 1 + lVar11) == cVar2)) ||
                 (*(int *)(lVar8 + 4 + lVar11 * 4) == -1)) {
                if (uVar6 == 0) {
                  *(undefined4 *)(lVar8 + lVar11 * 4) = *(undefined4 *)(lVar8 + -4 + lVar11 * 4);
                }
                goto LAB_001819df;
              }
              if (uVar6 == 0) {
                uVar6 = *(uint *)(lVar8 + -4 + lVar11 * 4);
              }
              b_external = false;
            }
            ContourTracing(this,(int)lVar11,(int)lVar10,uVar6,b_external);
          }
LAB_001819df:
          lVar11 = lVar11 + 1;
          uVar5 = (ulong)*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->
                                  field_0xc;
        } while (lVar11 < (long)uVar5);
      }
      lVar10 = lVar10 + 1;
      pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    } while (lVar10 < *(int *)&pMVar7->field_0x8);
  }
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (0 < *(int *)&pMVar4->field_0x8) {
    lVar10 = *(long *)&pMVar4->field_0x10;
    lVar8 = **(long **)&pMVar4->field_0x48;
    lVar9 = 0;
    do {
      if (0 < *(int *)&pMVar4->field_0xc) {
        lVar11 = 0;
        do {
          if (*(int *)(lVar10 + lVar11 * 4) == -1) {
            *(undefined4 *)(lVar10 + lVar11 * 4) = 0;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < *(int *)&pMVar4->field_0xc);
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + lVar8;
    } while (lVar9 < *(int *)&pMVar4->field_0x8);
  }
  puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0);

        n_labels_ = 0;
        for (int y = 0; y < img_.rows; y++) {
            const unsigned char* const img_row = img_.ptr<unsigned char>(y);
            unsigned int* const img_labels_out_row = img_labels_.ptr<unsigned int>(y);
            for (int x = 0; x < img_.cols; x++) {

                if (img_row[x] == byF) {
                    // Case 1
                    if (img_labels_out_row[x] == 0 && (x == 0 || img_row[x - 1] != byF)) {
                        n_labels_++;
                        ContourTracing(x, y, n_labels_, true);
                        continue;
                    }
                    // Case 2
                    else if (x < img_.cols - 1 && img_row[x + 1] != byF && img_labels_out_row[x + 1] != -1) {
                        if (img_labels_out_row[x] == 0) {
                            // Current pixel unlabeled
                            // Assing label of left pixel
                            ContourTracing(x, y, img_labels_out_row[x - 1], false);
                        }
                        else {
                            ContourTracing(x, y, img_labels_out_row[x], false);
                        }
                        continue;
                    }
                    // case 3
                    else if (img_labels_out_row[x] == 0) {
                        img_labels_out_row[x] = img_labels_out_row[x - 1];
                    }
                }
            }
        }

        // Reassign to contour background value (0)
        for (int r = 0; r < img_labels_.rows; ++r) {
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            for (int c = 0; c < img_labels_.cols; ++c) {
                if (img_labels_row[c] == -1)
                    img_labels_row[c] = 0;
            }
        }

        n_labels_++; // To count also background label
    }